

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_push_vocoldef_list(voccxdef *ctx,vocoldef *objlist,int cnt)

{
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  uint lstsiz;
  voccxdef *unaff_retaddr;
  uchar *lstp;
  int i;
  uchar *local_20;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
  }
  local_20 = voc_push_list_siz(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    if (*(short *)(in_RSI + (long)local_18 * 0x28) == -1) {
      *local_20 = '\x05';
      local_20 = local_20 + 1;
    }
    else {
      *local_20 = '\x02';
      oswp2(local_20 + 1,(uint)*(ushort *)(in_RSI + (long)local_18 * 0x28));
      local_20 = local_20 + 3;
    }
  }
  return;
}

Assistant:

void voc_push_vocoldef_list(voccxdef *ctx, vocoldef *objlist, int cnt)
{
    int i;
    uchar *lstp;
    uint lstsiz;

    /* 
     *   count the size - we need 3 bytes per object (1 for type plus 2
     *   for the value), and 1 byte per nil 
     */
    for (lstsiz = 0, i = 0 ; i < cnt ; ++i)
        lstsiz += (objlist[i].vocolobj == MCMONINV ? 1 : 3);

    /* allocate space for the list */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* enter the list elements */
    for (i = 0 ; i < cnt ; ++i)
    {
        if (objlist[i].vocolobj == MCMONINV)
        {
            /* store the nil */
            *lstp++ = DAT_NIL;
        }
        else
        {
            /* add the type prefix */
            *lstp++ = DAT_OBJECT;

            /* add the value */
            oswp2(lstp, objlist[i].vocolobj);
            lstp += 2;
        }
    }
}